

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O2

void Gia_ManSatokoDimacs(char *pFileName,satoko_opts_t *opts)

{
  int status;
  abctime aVar1;
  satoko_t *s;
  abctime aVar2;
  
  aVar1 = Abc_Clock();
  s = Gia_ManSatokoFromDimacs(pFileName,opts);
  if (s == (satoko_t *)0x0) {
    status = -1;
  }
  else {
    status = satoko_solve(s);
    satoko_destroy(s);
  }
  aVar2 = Abc_Clock();
  Gia_ManSatokoReport(-1,status,aVar2 - aVar1);
  return;
}

Assistant:

void Gia_ManSatokoDimacs( char * pFileName, satoko_opts_t * opts )
{
    abctime clk = Abc_Clock();  
    int status = SATOKO_UNSAT;
    satoko_t * pSat = Gia_ManSatokoFromDimacs( pFileName, opts );
    if ( pSat )
    {
        status = satoko_solve( pSat );
        satoko_destroy( pSat );
    }
    Gia_ManSatokoReport( -1, status, Abc_Clock() - clk );
}